

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

int sym_request(int pass,char *id,int relative)

{
  section_t *psVar1;
  int in_EDX;
  char *in_RSI;
  int in_EDI;
  int diff;
  section_t *targetsect;
  section_t *cursect;
  sym_t *psym;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  sym_t *local_20;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_EDI == 1) {
    iVar2 = 0;
  }
  else {
    local_20 = root;
    while ((local_20 != (sym_t *)0x0 && (iVar2 = strcmp(local_20->id,in_RSI), iVar2 != 0))) {
      local_20 = local_20->next;
    }
    if (local_20 == (sym_t *)0x0) {
      sym_declare(diff,(char *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),in_RSI,in_EDX,
                  in_stack_ffffffffffffffe8);
      cur->type = _extern;
      add_reloc((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (in_EDX != 0) {
        err(W,"relative jump to an external address");
      }
      iVar2 = 0;
    }
    else {
      psVar1 = get_current_section();
      if (local_20->type == _extern) {
        add_reloc((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        if (in_EDX != 0) {
          err(W,"relative jump to an external address");
        }
        iVar2 = 0;
      }
      else if (in_EDX == 0) {
        psVar1 = get_section_by_id(local_20->section_id);
        if (psVar1->type == org) {
          iVar2 = psVar1->offset + local_20->offset;
        }
        else {
          iVar2 = 0;
        }
      }
      else if (local_20->section_id == psVar1->id) {
        iVar2 = local_20->offset - (psVar1->pc + 2);
        if ((0x80 < iVar2) || (iVar2 < -0x7f)) {
          err(E,"relative jump to \'%s\' out of range",local_20->id);
          iVar2 = 0;
        }
      }
      else {
        err(W,"relative jump to a different section");
        add_reloc((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int sym_request(int pass, char* id, int relative)
{
    sym_t* psym;
    section_t* cursect;
    section_t* targetsect;

    if (pass == READ_PASS)
        return 0;
    
    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
            break;
        psym = psym->next;
    }

    /* The symbol cannot be found: create it, mark it as imported and add
    a relocation information */
    if (psym == NULL)
    {
        /* Force symbol declaration by simulating the read pass */
        sym_declare(READ_PASS, id, " ", 0, 0);
        cur->type = _extern;
        /* Use offset+1 since all jump instructions are 1 byte long */
        add_reloc(cur->sym_id, cur->section_id, cur->offset+1, relative);
        if (relative)
            err(W, "relative jump to an external address");

        return 0;
    }

    cursect = get_current_section();
    
    /* Imported symbol: add a relocation information */
    if (psym->type == _extern)
    {
        add_reloc(psym->sym_id, cursect->id, cursect->pc+1, relative);
        if (relative)
            err(W, "relative jump to an external address");
        return 0;
    }

    if (relative)
    {
        if (psym->section_id != cursect->id)
        {
            err(W, "relative jump to a different section");
            add_reloc(psym->section_id, cursect->id, cursect->pc, relative);
            return 0;
        }
        else
        {
            int diff = psym->offset - (cursect->pc + 2);
            if (diff > 128 || diff < -127)
            {
                err(E, "relative jump to '%s' out of range", psym->id);
                return 0;
            }
            return diff;
        }
    }


    targetsect = get_section_by_id(psym->section_id);
    if (targetsect->type == org)
        return targetsect->offset + psym->offset;

    TODO("Relocation");

    return 0;
}